

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
                float zero_deadzone_halfsize)

{
  ulong in_RCX;
  ulong in_RDX;
  unsigned_long_long in_RSI;
  byte in_R8B;
  bool bVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  undefined1 auVar11 [16];
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  unsigned_long_long v_clamped;
  float local_b4;
  double local_88;
  float local_7c;
  double local_78;
  float local_6c;
  unsigned_long_long local_68;
  float local_54;
  double local_50;
  double local_48;
  ulong local_20;
  ulong local_18;
  unsigned_long_long local_10;
  
  auVar5 = in_ZMM0._0_16_;
  fVar2 = in_ZMM0._0_4_;
  if (in_RDX == in_RCX) {
    return 0.0;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX < in_RCX) {
    local_68 = ImClamp<unsigned_long_long>(in_RSI,in_RDX,in_RCX);
  }
  else {
    local_68 = ImClamp<unsigned_long_long>(in_RSI,in_RCX,in_RDX);
  }
  if ((in_R8B & 1) == 0) {
    return (float)((double)(long)(local_68 - local_18) / (double)(long)(local_20 - local_18));
  }
  bVar1 = local_20 < local_18;
  if (bVar1) {
    ImSwap<unsigned_long_long>(&local_18,&local_20);
  }
  auVar5 = vcvtusi2sd_avx512f(auVar5,local_18);
  dVar3 = ImAbs(auVar5._0_8_);
  auVar5._0_8_ = (double)fVar2;
  auVar5._8_8_ = extraout_XMM0_Qb;
  if (auVar5._0_8_ <= dVar3) {
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_18);
    local_78 = auVar5._0_8_;
  }
  else {
    auVar5 = vcvtusi2ss_avx512f(auVar5,local_18);
    local_6c = fVar2;
    if (auVar5._0_4_ < 0.0) {
      local_6c = -fVar2;
    }
    local_78 = (double)local_6c;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_78;
  local_48 = local_78;
  auVar5 = vcvtusi2sd_avx512f(auVar6,local_20);
  dVar3 = ImAbs(auVar5._0_8_);
  auVar7._0_8_ = (double)fVar2;
  auVar7._8_8_ = extraout_XMM0_Qb_00;
  if (auVar7._0_8_ <= dVar3) {
    auVar5 = vcvtusi2sd_avx512f(auVar7,local_20);
    local_88 = auVar5._0_8_;
  }
  else {
    auVar5 = vcvtusi2ss_avx512f(auVar7,local_20);
    local_7c = fVar2;
    if (auVar5._0_4_ < 0.0) {
      local_7c = -fVar2;
    }
    local_88 = (double)local_7c;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_88;
  local_50 = local_88;
  auVar5 = vcvtusi2ss_avx512f(auVar8,local_18);
  if ((auVar5._0_4_ == 0.0) && (!NAN(auVar5._0_4_))) {
    auVar6 = vcvtusi2ss_avx512f(auVar5,local_20);
    auVar5 = (undefined1  [16])0x0;
    if (auVar6._0_4_ < 0.0) {
      auVar9._0_8_ = (double)-fVar2;
      auVar9._8_8_ = 0;
      local_48 = auVar9._0_8_;
      goto LAB_005d6bde;
    }
  }
  auVar9 = vcvtusi2ss_avx512f(auVar5,local_20);
  if ((auVar9._0_4_ == 0.0) && (!NAN(auVar9._0_4_))) {
    auVar5 = vcvtusi2ss_avx512f(auVar9,local_18);
    auVar9 = (undefined1  [16])0x0;
    if (auVar5._0_4_ < 0.0) {
      auVar9._0_8_ = (double)-fVar2;
      auVar9._8_8_ = 0;
      local_50 = auVar9._0_8_;
    }
  }
LAB_005d6bde:
  auVar5 = vcvtusi2sd_avx512f(auVar9,local_68);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_48;
  if (local_48 < auVar5._0_8_) {
    auVar5 = vcvtusi2sd_avx512f(auVar10,local_68);
    if (auVar5._0_8_ < local_50) {
      auVar5 = vcvtusi2ss_avx512f(auVar5,local_18 * local_20);
      if (0.0 <= auVar5._0_4_) {
        auVar5 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_18);
        if ((auVar5._0_4_ < 0.0) ||
           (auVar5 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_20), auVar5._0_4_ < 0.0)) {
          vcvtusi2sd_avx512f((undefined1  [16])0x0,local_68);
          dVar3 = ImLog(3.02522126110087e-317);
          dVar4 = ImLog(3.02525732789302e-317);
          local_54 = 1.0 - (float)(dVar3 / dVar4);
        }
        else {
          vcvtusi2sd_avx512f((undefined1  [16])0x0,local_68);
          dVar3 = ImLog(3.02528548963483e-317);
          dVar4 = ImLog(3.02529685314468e-317);
          local_54 = (float)(dVar3 / dVar4);
        }
      }
      else {
        auVar6 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_18);
        auVar5 = vcvtusi2ss_avx512f(auVar5,local_20);
        auVar7 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar2),local_18);
        local_54 = -auVar6._0_4_ / (auVar5._0_4_ - auVar7._0_4_);
        fVar2 = local_54 + in_XMM1_Da;
        auVar5 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar2),local_10);
        if ((auVar5._0_4_ != 0.0) || (NAN(auVar5._0_4_))) {
          auVar5 = vcvtusi2ss_avx512f(auVar5,local_10);
          if (0.0 <= auVar5._0_4_) {
            vcvtusi2sd_avx512f(ZEXT416((uint)fVar2),local_68);
            dVar3 = ImLog(3.02512294203735e-317);
            dVar4 = ImLog(3.02513974026931e-317);
            auVar11._0_4_ = (float)(dVar3 / dVar4);
            auVar11._4_4_ = (int)((ulong)dVar3 >> 0x20);
            auVar11._8_8_ = 0;
            auVar5 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar2)),auVar11,ZEXT416((uint)fVar2));
            local_54 = auVar5._0_4_;
          }
          else {
            vcvtusi2sd_avx512f((undefined1  [16])0x0,local_68);
            dVar3 = ImLog(3.02505229064999e-317);
            dVar4 = ImLog(3.02508045239181e-317);
            local_54 = (1.0 - (float)(dVar3 / dVar4)) * (local_54 - in_XMM1_Da);
          }
        }
      }
    }
    else {
      local_54 = 1.0;
    }
  }
  else {
    local_54 = 0.0;
  }
  if (bVar1) {
    local_b4 = 1.0 - local_54;
  }
  else {
    local_b4 = local_54;
  }
  return local_b4;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}